

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O3

bool crnlib::file_utils::get_pathname(char *p,dynamic_string *path)

{
  bool bVar1;
  char *pB;
  char *pA;
  dynamic_string temp_path;
  dynamic_string temp_drive;
  dynamic_string local_30;
  dynamic_string local_20;
  
  local_20.m_buf_size = 0;
  local_20.m_len = 0;
  local_20.m_pStr = (char *)0x0;
  local_30.m_buf_size = 0;
  local_30.m_len = 0;
  local_30.m_pStr = (char *)0x0;
  bVar1 = split_path(p,&local_20,&local_30,(dynamic_string *)0x0,(dynamic_string *)0x0);
  if (bVar1) {
    pA = local_20.m_pStr;
    if (local_20.m_pStr == (char *)0x0) {
      pA = "";
    }
    pB = local_30.m_pStr;
    if (local_30.m_pStr == (char *)0x0) {
      pB = "";
    }
    combine_path(path,pA,pB);
  }
  if ((local_30.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_30.m_pStr + -8) ^ *(uint *)(local_30.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_30.m_pStr + -0x10);
  }
  if ((local_20.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_20.m_pStr + -8) ^ *(uint *)(local_20.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_20.m_pStr + -0x10);
  }
  return bVar1;
}

Assistant:

bool file_utils::get_pathname(const char* p, dynamic_string& path)
    {
        dynamic_string temp_drive, temp_path;
        if (!split_path(p, &temp_drive, &temp_path, nullptr, nullptr))
        {
            return false;
        }

        combine_path(path, temp_drive.get_ptr(), temp_path.get_ptr());
        return true;
    }